

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int clone_bbs(gen_ctx_t gen_ctx)

{
  gen_ctx_t gen_ctx_00;
  int iVar1;
  bb_t_conflict pbVar2;
  out_edge_t peVar3;
  bb_insn_t_conflict pbVar4;
  MIR_insn_t pMVar5;
  MIR_op_t local_128;
  MIR_op_t local_f8;
  int local_bc;
  size_t sStack_b8;
  int res;
  size_t last_orig_bound;
  size_t len;
  size_t orig_size;
  size_t size;
  MIR_func_t func;
  bb_insn_t_conflict next_bb_insn;
  bb_insn_t_conflict dst_bb_insn;
  bb_insn_t_conflict bb_insn;
  edge_t_conflict e;
  bb_t_conflict new_bb;
  bb_t_conflict dst;
  bb_t_conflict bb;
  MIR_insn_t after;
  MIR_insn_t next_insn;
  MIR_insn_t label;
  MIR_insn_t new_insn;
  MIR_insn_t last_dst_insn;
  MIR_insn_t dst_insn;
  MIR_context_t ctx;
  gen_ctx_t pgStack_18;
  int max_bb_growth_factor;
  gen_ctx_t gen_ctx_local;
  
  ctx._4_4_ = 3;
  dst_insn = (MIR_insn_t)gen_ctx->ctx;
  size = *(size_t *)&gen_ctx->curr_func_item->u;
  pgStack_18 = gen_ctx;
  if (gen_ctx->optimize_level == 0) {
    __assert_fail("gen_ctx->optimize_level != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x7d3,"int clone_bbs(gen_ctx_t)");
  }
  bitmap_clear(gen_ctx->temp_bitmap);
  for (dst = DLIST_bb_t_head(&pgStack_18->curr_cfg->bbs); dst != (bb_t_conflict)0x0;
      dst = DLIST_bb_t_next(dst)) {
    bitmap_set_bit_p(pgStack_18->temp_bitmap,dst->index);
    dst_bb_insn = DLIST_bb_insn_t_tail(&dst->bb_insns);
    if ((dst_bb_insn != (bb_insn_t_conflict)0x0) &&
       (((int)*(undefined8 *)&dst_bb_insn->insn->field_0x18 == 0xab ||
        ((int)*(undefined8 *)&dst_bb_insn->insn->field_0x18 == 0xac)))) break;
  }
  if (dst == (bb_t_conflict)0x0) {
    gen_ctx_local._4_4_ = 0;
  }
  else {
    VARR_bb_ttrunc(pgStack_18->data_flow_ctx->worklist,0);
    for (dst = DLIST_bb_t_next(dst); dst != (bb_t_conflict)0x0; dst = DLIST_bb_t_next(dst)) {
      dst_bb_insn = DLIST_bb_insn_t_tail(&dst->bb_insns);
      if (dst_bb_insn == (bb_insn_t_conflict)0x0) {
        __assert_fail("bb_insn != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x7de,"int clone_bbs(gen_ctx_t)");
      }
      if ((((int)*(undefined8 *)&dst_bb_insn->insn->field_0x18 == 0x76) &&
          (bb_insn = (bb_insn_t_conflict)DLIST_out_edge_t_head(&dst->out_edges),
          bb_insn != (bb_insn_t_conflict)0x0)) &&
         (iVar1 = bitmap_bit_p(pgStack_18->temp_bitmap,(*(bb_t *)&bb_insn->gvn_val_const_p)->index),
         iVar1 != 0)) {
        VARR_bb_tpush(pgStack_18->data_flow_ctx->worklist,dst);
      }
    }
    local_bc = 0;
    sStack_b8 = VARR_bb_tlength(pgStack_18->data_flow_ctx->worklist);
    orig_size = 0;
    len = 0;
    while (last_orig_bound = VARR_bb_tlength(pgStack_18->data_flow_ctx->worklist),
          last_orig_bound != 0) {
      if (last_orig_bound < sStack_b8) {
        sStack_b8 = last_orig_bound;
        pbVar2 = VARR_bb_tlast(pgStack_18->data_flow_ctx->worklist);
        len = DLIST_bb_insn_t_length(&pbVar2->bb_insns);
        orig_size = len;
      }
      dst = VARR_bb_tpop(pgStack_18->data_flow_ctx->worklist);
      bb_insn = (bb_insn_t_conflict)DLIST_out_edge_t_head(&dst->out_edges);
      peVar3 = DLIST_out_edge_t_next((out_edge_t)bb_insn);
      if (peVar3 != (out_edge_t)0x0) {
        __assert_fail("(DLIST_out_edge_t_next (e)) == ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x7ed,"int clone_bbs(gen_ctx_t)");
      }
      if (*(char *)((long)&bb_insn->bb + 1) == '\0') {
        dst_bb_insn = DLIST_bb_insn_t_tail(&dst->bb_insns);
        if ((dst_bb_insn == (bb_insn_t_conflict)0x0) ||
           ((int)*(undefined8 *)&dst_bb_insn->insn->field_0x18 != 0x76)) {
          __assert_fail("bb_insn != ((void*)0) && bb_insn->insn->code == MIR_JMP",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x7f0,"int clone_bbs(gen_ctx_t)");
        }
        new_bb = *(bb_t_conflict *)&bb_insn->gvn_val_const_p;
        next_bb_insn = DLIST_bb_insn_t_tail(&new_bb->bb_insns);
        if ((((int)*(undefined8 *)&next_bb_insn->insn->field_0x18 != 0xab) &&
            ((int)*(undefined8 *)&next_bb_insn->insn->field_0x18 != 0xac)) &&
           (((int)*(undefined8 *)&next_bb_insn->insn->field_0x18 != 0xaa && (orig_size <= len * 3)))
           ) {
          local_bc = 1;
          if ((pgStack_18->debug_file != (FILE *)0x0) && (1 < pgStack_18->debug_level)) {
            fprintf((FILE *)pgStack_18->debug_file,"  Cloning from BB%lu into BB%lu:\n",
                    new_bb->index,dst->index);
          }
          pbVar4 = DLIST_bb_insn_t_tail(&new_bb->bb_insns);
          new_insn = pbVar4->insn;
          bb = (bb_t_conflict)DLIST_MIR_insn_t_prev(dst_bb_insn->insn);
          gen_delete_insn(pgStack_18,dst_bb_insn->insn);
          dst_bb_insn = (bb_insn_t_conflict)0x0;
          for (next_bb_insn = DLIST_bb_insn_t_head(&new_bb->bb_insns);
              next_bb_insn != (bb_insn_t_conflict)0x0;
              next_bb_insn = DLIST_bb_insn_t_next(next_bb_insn)) {
            last_dst_insn = next_bb_insn->insn;
            if ((int)*(undefined8 *)&last_dst_insn->field_0x18 != 0xb4) {
              label = MIR_copy_insn((MIR_context_t)dst_insn,last_dst_insn);
              MIR_insert_insn_after
                        ((MIR_context_t)dst_insn,pgStack_18->curr_func_item,(MIR_insn_t_conflict)bb,
                         label);
              add_new_bb_insn(pgStack_18,label,dst,1);
              bb = (bb_t_conflict)label;
              if ((pgStack_18->debug_file != (FILE *)0x0) && (1 < pgStack_18->debug_level)) {
                fprintf((FILE *)pgStack_18->debug_file,"  Adding insn %-5lu",
                        (ulong)*(uint *)((long)label->data + 0xc));
                MIR_output_insn((MIR_context_t)dst_insn,pgStack_18->debug_file,label,
                                (MIR_func_t)size,1);
              }
              orig_size = orig_size + 1;
            }
          }
          delete_edge((edge_t_conflict)bb_insn);
          if (new_insn == (MIR_insn_t)0x0) {
            __assert_fail("last_dst_insn != ((void*)0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x810,"int clone_bbs(gen_ctx_t)");
          }
          if ((int)*(undefined8 *)&new_insn->field_0x18 == 0x76) {
            next_insn = (MIR_insn_t)new_insn->ops[0].u.ref;
            create_edge(pgStack_18,dst,*(bb_t_conflict *)((long)next_insn->data + 0x30),0,1);
            iVar1 = bitmap_bit_p(pgStack_18->temp_bitmap,
                                 (ulong)*(uint *)((long)next_insn->data + 0xc));
            if (iVar1 != 0) {
              VARR_bb_tpush(pgStack_18->data_flow_ctx->worklist,dst);
            }
          }
          else {
            iVar1 = MIR_branch_code_p((MIR_insn_code_t)*(undefined8 *)&new_insn->field_0x18);
            gen_ctx_00 = pgStack_18;
            if (iVar1 == 0) {
              after = DLIST_MIR_insn_t_next(new_insn);
              pMVar5 = dst_insn;
              func = (MIR_func_t)after->data;
              if ((int)*(undefined8 *)&after->field_0x18 != 0xb4) {
                __assert_fail("next_insn->code == MIR_LABEL",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x819,"int clone_bbs(gen_ctx_t)");
              }
              MIR_new_label_op(&local_f8,(MIR_context_t)dst_insn,after);
              label = MIR_new_insn((MIR_context_t)pMVar5,MIR_JMP);
              MIR_insert_insn_after
                        ((MIR_context_t)dst_insn,pgStack_18->curr_func_item,(MIR_insn_t_conflict)bb,
                         label);
              add_new_bb_insn(pgStack_18,label,dst,1);
              iVar1 = bitmap_bit_p(pgStack_18->temp_bitmap,
                                   (ulong)*(uint *)((long)&func->func_item + 4));
              if (iVar1 != 0) {
                VARR_bb_tpush(pgStack_18->data_flow_ctx->worklist,dst);
              }
              create_edge(pgStack_18,dst,*(bb_t_conflict *)((long)after->data + 0x30),0,1);
            }
            else {
              pMVar5 = DLIST_MIR_insn_t_next(new_insn);
              next_insn = get_insn_label(gen_ctx_00,pMVar5);
              pMVar5 = dst_insn;
              MIR_new_label_op(&local_128,(MIR_context_t)dst_insn,next_insn);
              label = MIR_new_insn((MIR_context_t)pMVar5,MIR_JMP);
              MIR_insert_insn_after
                        ((MIR_context_t)dst_insn,pgStack_18->curr_func_item,(MIR_insn_t_conflict)bb,
                         label);
              e = (edge_t_conflict)create_bb(pgStack_18,label);
              insert_new_bb_after(pgStack_18,dst,(bb_t_conflict)e);
              iVar1 = bitmap_bit_p(pgStack_18->temp_bitmap,
                                   **(size_t **)((long)next_insn->data + 0x30));
              if (iVar1 != 0) {
                VARR_bb_tpush(pgStack_18->data_flow_ctx->worklist,(bb_t_conflict)e);
              }
              create_edge(pgStack_18,dst,(bb_t_conflict)e,1,1);
              create_edge(pgStack_18,dst,
                          *(bb_t_conflict *)((long)(new_insn->ops[0].u.ref)->data + 0x30),0,1);
              create_edge(pgStack_18,(bb_t_conflict)e,
                          *(bb_t_conflict *)((long)next_insn->data + 0x30),0,1);
            }
          }
          if ((pgStack_18->debug_file != (FILE *)0x0) && (1 < pgStack_18->debug_level)) {
            fprintf((FILE *)pgStack_18->debug_file,"  Result BB%lu:\n",dst->index);
            output_in_edges(pgStack_18,dst);
            output_out_edges(pgStack_18,dst);
            for (dst_bb_insn = DLIST_bb_insn_t_head(&dst->bb_insns);
                dst_bb_insn != (bb_insn_t_conflict)0x0;
                dst_bb_insn = DLIST_bb_insn_t_next(dst_bb_insn)) {
              fprintf((FILE *)pgStack_18->debug_file,"  %-5lu",(ulong)dst_bb_insn->index);
              MIR_output_insn((MIR_context_t)dst_insn,pgStack_18->debug_file,dst_bb_insn->insn,
                              (MIR_func_t)size,1);
            }
          }
        }
      }
    }
    if (local_bc != 0) {
      remove_unreachable_bbs(pgStack_18);
      enumerate_bbs(pgStack_18);
    }
    gen_ctx_local._4_4_ = local_bc;
  }
  return gen_ctx_local._4_4_;
}

Assistant:

static int clone_bbs (gen_ctx_t gen_ctx) {
  const int max_bb_growth_factor = 3;
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_insn_t dst_insn, last_dst_insn, new_insn, label, next_insn, after;
  bb_t bb, dst, new_bb;
  edge_t e;
  bb_insn_t bb_insn, dst_bb_insn, next_bb_insn;
  MIR_func_t func = curr_func_item->u.func;
  size_t size, orig_size, len, last_orig_bound;
  int res;

  gen_assert (optimize_level != 0);
  bitmap_clear (temp_bitmap);
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    bitmap_set_bit_p (temp_bitmap, bb->index);
    if ((bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns)) == NULL) continue;
    if (bb_insn->insn->code == MIR_RET || bb_insn->insn->code == MIR_JRET) break;
  }
  if (bb == NULL) return FALSE;
  VARR_TRUNC (bb_t, worklist, 0);
  for (bb = DLIST_NEXT (bb_t, bb); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns);
    gen_assert (bb_insn != NULL);
    if (bb_insn->insn->code == MIR_JMP && (e = DLIST_HEAD (out_edge_t, bb->out_edges)) != NULL
        && bitmap_bit_p (temp_bitmap, e->dst->index))
      VARR_PUSH (bb_t, worklist, bb);
  }
  res = FALSE;
  last_orig_bound = VARR_LENGTH (bb_t, worklist);
  orig_size = size = 0;
  while ((len = VARR_LENGTH (bb_t, worklist)) != 0) {
    if (last_orig_bound > len) {
      last_orig_bound = len;
      orig_size = size = DLIST_LENGTH (bb_insn_t, VARR_LAST (bb_t, worklist)->bb_insns);
    }
    bb = VARR_POP (bb_t, worklist);
    e = DLIST_HEAD (out_edge_t, bb->out_edges);
    gen_assert (DLIST_NEXT (out_edge_t, e) == NULL);
    if (e->back_edge_p) continue;
    bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns);
    gen_assert (bb_insn != NULL && bb_insn->insn->code == MIR_JMP);
    dst = e->dst;
    dst_bb_insn = DLIST_TAIL (bb_insn_t, dst->bb_insns);
    if (dst_bb_insn->insn->code == MIR_RET || dst_bb_insn->insn->code == MIR_JRET
        || dst_bb_insn->insn->code == MIR_SWITCH || size > max_bb_growth_factor * orig_size)
      continue;
    res = TRUE;
    DEBUG (2, {
      fprintf (debug_file, "  Cloning from BB%lu into BB%lu:\n", (unsigned long) dst->index,
               (unsigned long) bb->index);
    });
    last_dst_insn = DLIST_TAIL (bb_insn_t, dst->bb_insns)->insn;
    after = DLIST_PREV (MIR_insn_t, bb_insn->insn);
    gen_delete_insn (gen_ctx, bb_insn->insn);
    bb_insn = NULL;
    for (dst_bb_insn = DLIST_HEAD (bb_insn_t, dst->bb_insns); dst_bb_insn != NULL;
         dst_bb_insn = DLIST_NEXT (bb_insn_t, dst_bb_insn)) {
      dst_insn = dst_bb_insn->insn;
      if (dst_insn->code == MIR_LABEL) continue;
      new_insn = MIR_copy_insn (ctx, dst_insn);
      /* we can not use gen_add_insn_xxx becuase of some cases (e.g. bb_insn is the last insn): */
      MIR_insert_insn_after (ctx, curr_func_item, after, new_insn);
      add_new_bb_insn (gen_ctx, new_insn, bb, TRUE);
      after = new_insn;
      DEBUG (2, {
        fprintf (debug_file, "  Adding insn %-5lu",
                 (unsigned long) ((bb_insn_t) new_insn->data)->index);
        MIR_output_insn (ctx, debug_file, new_insn, func, TRUE);
      });
      size++;
    }
    delete_edge (e);
    gen_assert (last_dst_insn != NULL);
    if (last_dst_insn->code == MIR_JMP) {
      label = last_dst_insn->ops[0].u.label;
      create_edge (gen_ctx, bb, ((bb_insn_t) label->data)->bb, FALSE, TRUE);
      if (bitmap_bit_p (temp_bitmap, ((bb_insn_t) label->data)->index))
        VARR_PUSH (bb_t, worklist, bb);
    } else if (!MIR_branch_code_p (last_dst_insn->code)) {
      next_insn = DLIST_NEXT (MIR_insn_t, last_dst_insn);
      next_bb_insn = next_insn->data;
      gen_assert (next_insn->code == MIR_LABEL);
      new_insn = MIR_new_insn (ctx, MIR_JMP, MIR_new_label_op (ctx, next_insn));
      MIR_insert_insn_after (ctx, curr_func_item, after, new_insn);
      add_new_bb_insn (gen_ctx, new_insn, bb, TRUE);
      if (bitmap_bit_p (temp_bitmap, next_bb_insn->index)) VARR_PUSH (bb_t, worklist, bb);
      create_edge (gen_ctx, bb, ((bb_insn_t) next_insn->data)->bb, FALSE, TRUE);
    } else {
      label = get_insn_label (gen_ctx, DLIST_NEXT (MIR_insn_t, last_dst_insn)); /* fallthrough */
      new_insn = MIR_new_insn (ctx, MIR_JMP, MIR_new_label_op (ctx, label));
      MIR_insert_insn_after (ctx, curr_func_item, after, new_insn);
      new_bb = create_bb (gen_ctx, new_insn);
      insert_new_bb_after (gen_ctx, bb, new_bb);
      if (bitmap_bit_p (temp_bitmap, ((bb_insn_t) label->data)->bb->index))
        VARR_PUSH (bb_t, worklist, new_bb);
      create_edge (gen_ctx, bb, new_bb, TRUE, TRUE); /* fall through */
      create_edge (gen_ctx, bb, ((bb_insn_t) last_dst_insn->ops[0].u.label->data)->bb, FALSE,
                   TRUE); /* branch */
      create_edge (gen_ctx, new_bb, ((bb_insn_t) label->data)->bb, FALSE, TRUE);
    }
    DEBUG (2, {
      fprintf (debug_file, "  Result BB%lu:\n", (unsigned long) bb->index);
      output_in_edges (gen_ctx, bb);
      output_out_edges (gen_ctx, bb);
      for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL;
           bb_insn = DLIST_NEXT (bb_insn_t, bb_insn)) {
        fprintf (debug_file, "  %-5lu", (unsigned long) bb_insn->index);
        MIR_output_insn (ctx, debug_file, bb_insn->insn, func, TRUE);
      }
    });
  }
  if (res) {
    remove_unreachable_bbs (gen_ctx);
    enumerate_bbs (gen_ctx);
  }
  return res;
}